

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

void __thiscall sqvector<char>::resize(sqvector<char> *this,SQUnsignedInteger newsize,char *fill)

{
  char *pcVar1;
  ulong uVar2;
  
  if (this->_allocated < newsize) {
    pcVar1 = (char *)sq_vm_realloc(this->_vals,this->_allocated,newsize);
    this->_vals = pcVar1;
    this->_allocated = newsize;
  }
  if (this->_size < newsize) {
    uVar2 = this->_size;
    while (uVar2 < newsize) {
      this->_vals[uVar2] = *fill;
      uVar2 = this->_size + 1;
      this->_size = uVar2;
    }
  }
  else {
    this->_size = newsize;
  }
  return;
}

Assistant:

void resize(SQUnsignedInteger newsize, const T& fill = T())
    {
        if(newsize > _allocated)
            _realloc(newsize);
        if(newsize > _size) {
            while(_size < newsize) {
                new ((void *)&_vals[_size]) T(fill);
                _size++;
            }
        }
        else{
            for(SQUnsignedInteger i = newsize; i < _size; i++) {
                _vals[i].~T();
            }
            _size = newsize;
        }
    }